

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# motion_search_facade.c
# Opt level: O1

int av1_joint_motion_search
              (AV1_COMP *cpi,MACROBLOCK *x,BLOCK_SIZE bsize,int_mv *cur_mv,uint8_t *mask,
              int mask_stride,int *rate_mv,int allow_second_mv,int joint_me_num_refine_iter)

{
  buf_2d *pbVar1;
  undefined8 *puVar2;
  char cVar3;
  MB_MODE_INFO *pMVar4;
  MvCosts *mvjcost;
  YV12_BUFFER_CONFIG *src;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  uint8_t *puVar9;
  uint8_t *puVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  AV1_COMMON *pAVar13;
  MotionVectorSearchParams *pMVar14;
  MotionVectorSearchParams *pMVar15;
  AV1_COMP *cpi_00;
  byte search_method;
  int_mv iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  long lVar20;
  InterpFilterParams *pIVar21;
  buf_2d *pbVar22;
  buf_2d *pbVar23;
  ulong uVar24;
  uint uVar25;
  undefined7 in_register_00000011;
  buf_2d *pbVar26;
  int_mv *piVar27;
  uint num_planes;
  long lVar28;
  InterpFilterParams *pIVar29;
  uint uVar30;
  search_site_config *search_sites;
  long lVar31;
  FULLPEL_MV start_mv;
  bool bVar32;
  bool bVar33;
  bool bVar34;
  int_mv best_mv;
  int_mv second_best_mv;
  int_mv *local_84b8;
  ulong local_84b0;
  MACROBLOCKD *local_84a8;
  uint local_84a0;
  uint local_849c;
  int local_8498;
  uint local_8494;
  int last_besterr [2];
  undefined8 local_8488;
  ulong local_8480;
  uint8_t *local_8478;
  int local_846c;
  int local_8468;
  uint local_8464;
  uint local_8460;
  uint local_845c;
  uint local_8458;
  MV this_best_mv;
  uint sse;
  int dis;
  AV1_COMMON *local_8448;
  search_site_config *local_8440;
  AV1_COMP *local_8438;
  uint8_t *local_8430;
  ulong local_8428;
  ulong local_8420;
  YV12_BUFFER_CONFIG *scaled_ref_frame [2];
  int_mv ref_mv [2];
  buf_2d ref_yv12 [2];
  InterPredParams local_8368;
  FULLPEL_MV_STATS best_mv_stats;
  SUBPEL_MOTION_SEARCH_PARAMS ms_params;
  FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
  buf_2d backup_yv12 [2] [3];
  uint8_t second_pred16 [32768];
  
  local_8464 = (uint)CONCAT71(in_register_00000011,bsize);
  uVar19 = CONCAT71(in_register_00000011,bsize) & 0xffffffff;
  pMVar4 = *(x->e_mbd).mi;
  local_8488 = *(undefined8 *)cur_mv;
  cVar3 = pMVar4->ref_frame[1];
  mvjcost = x->mv_costs;
  local_8420 = (ulong)(uint)(x->e_mbd).mi_row;
  local_8428 = (ulong)(uint)(x->e_mbd).mi_col;
  last_besterr[0] = 0x7fffffff;
  last_besterr[1] = 0x7fffffff;
  local_849c = (uint)block_size_wide[uVar19];
  local_84a0 = (uint)block_size_high[uVar19];
  local_84a8 = (MACROBLOCKD *)
               CONCAT71(local_84a8._1_7_,((cpi->common).seq_params)->monochrome == '\0');
  local_84b8 = cur_mv;
  local_8498 = mask_stride;
  local_8430 = mask;
  scaled_ref_frame[0] = av1_get_scaled_ref_frame(cpi,(int)pMVar4->ref_frame[0]);
  local_8438 = cpi;
  scaled_ref_frame[1] = av1_get_scaled_ref_frame(cpi,(int)cVar3);
  local_8478 = (uint8_t *)((ulong)second_pred16 >> 1);
  if ((((x->e_mbd).cur_buf)->flags & 8) == 0) {
    local_8478 = second_pred16;
  }
  if (0 < joint_me_num_refine_iter) {
    local_8448 = &local_8438->common;
    num_planes = (uint)(byte)local_84a8 * 2 + 1;
    local_84a8 = &x->e_mbd;
    pbVar1 = (x->e_mbd).plane[0].pre;
    local_8468 = (int)local_8420 * 4;
    pIVar29 = av1_interp_4tap;
    pIVar21 = av1_interp_4tap;
    if ((0x10003UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      pIVar21 = av1_interp_filter_params_list;
    }
    local_846c = (int)local_8428 * 4;
    pAVar13 = &local_8438->common;
    if ((0x20005UL >> ((ulong)bsize & 0x3f) & 1) == 0) {
      pIVar29 = av1_interp_filter_params_list;
    }
    local_8494 = local_84a0;
    if ((byte)local_849c < (byte)local_84a0) {
      local_8494 = local_849c;
    }
    local_845c = 1;
    if (1 < joint_me_num_refine_iter * 2) {
      local_845c = joint_me_num_refine_iter * 2;
    }
    lVar31 = (ulong)num_planes * 0xa30;
    local_8440 = x->search_site_cfg_buf;
    pMVar14 = &local_8438->mv_search_params;
    pMVar15 = &local_8438->mv_search_params;
    uVar25 = 0;
    do {
      uVar30 = uVar25 & 1;
      if ((uVar25 < 2) ||
         (uVar19 = (ulong)((uVar30 ^ 1) << 2),
         *(int *)((long)local_84b8 + uVar19) != *(int *)((long)&local_8488 + uVar19))) {
LAB_003cbdcd:
        pbVar23 = backup_yv12[0];
        pbVar26 = pbVar1;
        lVar28 = 0;
        local_84b0 = (ulong)uVar30;
        local_8480 = (ulong)uVar30;
        local_8458 = uVar25;
        do {
          iVar16 = av1_get_ref_mv(x,(int)lVar28);
          ref_mv[lVar28] = iVar16;
          src = scaled_ref_frame[lVar28];
          if (src != (YV12_BUFFER_CONFIG *)0x0) {
            lVar20 = 0;
            pbVar22 = pbVar23;
            do {
              puVar2 = (undefined8 *)((long)&pbVar26->buf + lVar20);
              puVar9 = (uint8_t *)*puVar2;
              puVar10 = (uint8_t *)puVar2[1];
              puVar2 = (undefined8 *)((long)&pbVar26->width + lVar20);
              uVar11 = *puVar2;
              uVar12 = puVar2[1];
              pbVar22->width = (int)uVar11;
              pbVar22->height = (int)((ulong)uVar11 >> 0x20);
              *(undefined8 *)&pbVar22->stride = uVar12;
              ((buf_2d *)&pbVar22->buf)->buf = puVar9;
              pbVar22->buf0 = puVar10;
              pbVar22 = pbVar22 + 1;
              lVar20 = lVar20 + 0xa30;
            } while (lVar31 - lVar20 != 0);
            av1_setup_pre_planes
                      (local_84a8,(int)lVar28,src,(int)local_8420,(int)local_8428,
                       (scale_factors *)0x0,num_planes);
          }
          piVar27 = local_84b8;
          pbVar23 = pbVar23 + 3;
          pbVar26 = pbVar26 + 1;
          bVar32 = lVar28 == 0;
          lVar28 = lVar28 + 1;
        } while (bVar32);
        ref_yv12[0].width = (x->e_mbd).plane[0].pre[0].width;
        ref_yv12[0].height = (x->e_mbd).plane[0].pre[0].height;
        ref_yv12[0].stride = (x->e_mbd).plane[0].pre[0].stride;
        ref_yv12[0]._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c;
        ref_yv12[0].buf = pbVar1->buf;
        ref_yv12[0].buf0 = (x->e_mbd).plane[0].pre[0].buf0;
        ref_yv12[1].width = (x->e_mbd).plane[0].pre[1].width;
        ref_yv12[1].height = (x->e_mbd).plane[0].pre[1].height;
        ref_yv12[1].stride = (x->e_mbd).plane[0].pre[1].stride;
        ref_yv12[1]._28_4_ = *(undefined4 *)&(x->e_mbd).plane[0].pre[1].field_0x1c;
        ref_yv12[1].buf = (x->e_mbd).plane[0].pre[1].buf;
        ref_yv12[1].buf0 = (x->e_mbd).plane[0].pre[1].buf0;
        local_8368.bit_depth = (x->e_mbd).bd;
        uVar25 = (uint)local_84b0;
        local_8368.block_width = local_849c;
        local_8368.block_height = local_84a0;
        local_8368.pix_row = local_8468;
        local_8368.pix_col = local_846c;
        local_8368.subsampling_x = 0;
        local_8368.subsampling_y = 0;
        local_8368.use_hbd_buf = (uint)((x->e_mbd).cur_buf)->flags >> 3 & 1;
        uVar19 = (ulong)((uVar25 ^ 1) << 5);
        local_8368.is_intrabc = 0;
        local_8368.mode = TRANSLATION_PRED;
        local_8368.comp_mode = UNIFORM_SINGLE;
        local_8368.top = -0x47000;
        local_8368.left = -0x47000;
        local_8368.interp_filter_params[0] = pIVar21;
        local_8368.interp_filter_params[1] = pIVar29;
        local_8368.scale_factors = &pAVar13->sf_identity;
        local_8368.ref_frame_buf.buf = *(uint8_t **)((long)&ref_yv12[0].buf + uVar19);
        local_8368.ref_frame_buf.buf0 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar19);
        local_8368.ref_frame_buf._16_8_ = *(undefined8 *)((long)&ref_yv12[0].width + uVar19);
        local_8368.ref_frame_buf._24_8_ = *(undefined8 *)((long)&ref_yv12[0].stride + uVar19);
        local_8368.conv_params.round_1 = 0x15 - local_8368.bit_depth;
        local_8368.conv_params.round_0 = local_8368.bit_depth + -7;
        if (local_8368.bit_depth < 0xb) {
          local_8368.conv_params.round_0 = 3;
        }
        local_8368.conv_params.do_average = 0;
        local_8368.conv_params.dst = (CONV_BUF_TYPE *)0x0;
        local_8368.conv_params.dst_stride = 0;
        if (local_8368.bit_depth < 0xb) {
          local_8368.conv_params.round_1 = 0xb;
        }
        local_8368.conv_params.plane = 0;
        local_8368.conv_params.is_compound = 0;
        local_8368.conv_params.use_dist_wtd_comp_avg = 0;
        av1_enc_build_one_inter_predictor
                  (local_8478,local_849c,&local_84b8[uVar25 ^ 1].as_mv,&local_8368);
        cpi_00 = local_8438;
        if (uVar25 != 0) {
          uVar19 = (ulong)(uVar25 << 5);
          uVar5 = *(undefined4 *)((long)&ref_yv12[0].buf + uVar19);
          uVar6 = *(undefined4 *)((long)&ref_yv12[0].buf + uVar19 + 4);
          uVar7 = *(undefined4 *)((long)&ref_yv12[0].buf0 + uVar19);
          uVar8 = *(undefined4 *)((long)&ref_yv12[0].buf0 + uVar19 + 4);
          uVar11 = *(undefined8 *)((long)&ref_yv12[0].width + uVar19);
          uVar12 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar19);
          (x->e_mbd).plane[0].pre[0].width = (int)uVar11;
          (x->e_mbd).plane[0].pre[0].height = (int)((ulong)uVar11 >> 0x20);
          *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uVar12;
          *(undefined4 *)&pbVar1->buf = uVar5;
          *(undefined4 *)((long)&(x->e_mbd).plane[0].pre[0].buf + 4) = uVar6;
          *(undefined4 *)&(x->e_mbd).plane[0].pre[0].buf0 = uVar7;
          *(undefined4 *)((long)&(x->e_mbd).plane[0].pre[0].buf0 + 4) = uVar8;
        }
        search_method = (local_8438->sf).mv_sf.search_method;
        iVar17 = (local_8438->sf).mv_sf.use_bsize_dependent_search_method;
        if ((0x1f < (byte)local_8494 && iVar17 == 1) ||
           (((1 < iVar17 && 0xf < (byte)local_8494 &&
             ((x->content_state_sb).source_sad_nonrd < kHighSad)) && (x->qindex < 0xc0)))) {
          if (search_method < 0xb) {
            search_method = (&DAT_0056f480)[search_method];
          }
          else {
            search_method = 0;
          }
        }
        iVar17 = (x->e_mbd).plane[0].pre[0].stride;
        search_sites = pMVar15->search_site_cfg[0];
        if (((iVar17 != (local_8438->mv_search_params).search_site_cfg[0][0].stride) &&
            (search_sites = pMVar14->search_site_cfg[1],
            iVar17 != (local_8438->mv_search_params).search_site_cfg[1][0].stride)) &&
           (search_sites = local_8440, iVar17 != local_8440[""[search_method]].stride)) {
          (*av1_init_motion_compensation[""[""[search_method]]])
                    (local_8440 + ""[""[search_method]],iVar17,SUB14((search_method & 0xfe) == 2,0))
          ;
          uVar25 = (uint)local_84b0;
          piVar27 = local_84b8;
        }
        uVar19 = (ulong)(uVar25 * 4);
        uVar25 = (uint)*(short *)((long)piVar27 + uVar19 + 2);
        start_mv = (FULLPEL_MV)
                   (((int)*(short *)((long)piVar27 + uVar19) -
                    (~(int)*(short *)((long)piVar27 + uVar19) >> 0x1f)) + 3U >> 3 & 0xffff |
                   (uVar25 - ((int)~uVar25 >> 0x1f)) * 0x2000 + 0x6000 & 0xffff0000);
        local_8460 = local_8464 & 0xff;
        av1_make_default_fullpel_ms_params
                  (&full_ms_params,cpi_00,x,(BLOCK_SIZE)local_8464,(MV *)((long)ref_mv + uVar19),
                   start_mv,search_sites,search_method,0);
        full_ms_params.ms_buffers.second_pred = local_8478;
        full_ms_params.ms_buffers.mask = local_8430;
        full_ms_params.ms_buffers.mask_stride = local_8498;
        full_ms_params.ms_buffers.inv_mask = (int)local_84b0;
        if (((cpi_00->sf).mv_sf.disable_extensive_joint_motion_search == 0) &&
           ((pMVar4->interinter_comp).type != '\x02')) {
          iVar17 = av1_full_pixel_search
                             (start_mv,&full_ms_params,5,(int *)0x0,&best_mv.as_fullmv,
                              &best_mv_stats,&second_best_mv.as_fullmv);
        }
        else {
          iVar17 = av1_refining_search_8p_c(&full_ms_params,start_mv,&best_mv.as_fullmv);
          second_best_mv = best_mv;
        }
        bVar32 = second_best_mv.as_int != 0x80008000;
        bVar33 = second_best_mv.as_int != best_mv.as_int;
        if ((int)local_84b0 != 0) {
          (x->e_mbd).plane[0].pre[0].width = ref_yv12[0].width;
          (x->e_mbd).plane[0].pre[0].height = ref_yv12[0].height;
          (x->e_mbd).plane[0].pre[0].stride = ref_yv12[0].stride;
          *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = ref_yv12[0]._28_4_;
          pbVar1->buf = ref_yv12[0].buf;
          (x->e_mbd).plane[0].pre[0].buf0 = ref_yv12[0].buf0;
        }
        pbVar23 = backup_yv12[0];
        pbVar26 = pbVar1;
        lVar28 = 0;
        do {
          if (scaled_ref_frame[lVar28] != (YV12_BUFFER_CONFIG *)0x0) {
            lVar20 = 0;
            pbVar22 = pbVar23;
            do {
              puVar9 = ((buf_2d *)&pbVar22->buf)->buf;
              puVar10 = pbVar22->buf0;
              uVar11 = *(undefined8 *)&pbVar22->stride;
              puVar2 = (undefined8 *)((long)&pbVar26->width + lVar20);
              *puVar2 = *(undefined8 *)&pbVar22->width;
              puVar2[1] = uVar11;
              puVar2 = (undefined8 *)((long)&pbVar26->buf + lVar20);
              *puVar2 = puVar9;
              puVar2[1] = puVar10;
              lVar20 = lVar20 + 0xa30;
              pbVar22 = pbVar22 + 1;
            } while (lVar31 - lVar20 != 0);
            puVar9 = pbVar1[lVar28].buf;
            puVar10 = pbVar1[lVar28].buf0;
            pbVar22 = (x->e_mbd).plane[0].pre + lVar28;
            iVar18 = pbVar22->height;
            uVar11 = *(undefined8 *)(&pbVar22->width + 2);
            ref_yv12[lVar28].width = pbVar22->width;
            ref_yv12[lVar28].height = iVar18;
            *(undefined8 *)&ref_yv12[lVar28].stride = uVar11;
            ref_yv12[lVar28].buf = puVar9;
            ref_yv12[lVar28].buf0 = puVar10;
          }
          pbVar26 = pbVar26 + 1;
          pbVar23 = pbVar23 + 3;
          bVar34 = lVar28 == 0;
          lVar28 = lVar28 + 1;
        } while (bVar34);
        if ((int)local_84b0 != 0) {
          uVar24 = (ulong)(uint)((int)local_8480 << 5);
          puVar9 = *(uint8_t **)((long)&ref_yv12[0].buf + uVar24);
          puVar10 = *(uint8_t **)((long)&ref_yv12[0].buf0 + uVar24);
          uVar11 = *(undefined8 *)((long)&ref_yv12[0].width + uVar24);
          uVar12 = *(undefined8 *)((long)&ref_yv12[0].stride + uVar24);
          (x->e_mbd).plane[0].pre[0].width = (int)uVar11;
          (x->e_mbd).plane[0].pre[0].height = (int)((ulong)uVar11 >> 0x20);
          *(undefined8 *)&(x->e_mbd).plane[0].pre[0].stride = uVar12;
          pbVar1->buf = puVar9;
          (x->e_mbd).plane[0].pre[0].buf0 = puVar10;
        }
        bVar34 = (cpi_00->common).features.cur_frame_force_integer_mv;
        if (bVar34 == true) {
          best_mv.as_int = (best_mv.as_int >> 0x10) * 0x80000 + (best_mv.as_int & 0x1fff) * 8;
        }
        uVar24 = local_8480;
        iVar18 = 0x7fffffff;
        if ((iVar17 != 0x7fffffff) && (iVar18 = iVar17, bVar34 == false)) {
          av1_make_default_subpel_ms_params
                    (&ms_params,cpi_00,x,(BLOCK_SIZE)local_8460,(MV *)((long)ref_mv + uVar19),
                     (int *)0x0);
          ms_params.var_params.ms_buffers.second_pred = local_8478;
          ms_params.var_params.ms_buffers.mask = local_8430;
          ms_params.var_params.ms_buffers.mask_stride = local_8498;
          ms_params.var_params.ms_buffers.inv_mask = (int)local_84b0;
          ms_params.forced_stop = '\0';
          iVar18 = (*(cpi_00->mv_search_params).find_fractional_mv_step)
                             (local_84a8,local_8448,&ms_params,
                              (MV)((best_mv.as_int >> 0x10) * 0x80000 +
                                  (best_mv.as_int & 0x1fff) * 8),(FULLPEL_MV_STATS *)0x0,
                              (MV *)&best_mv,&dis,&sse,(int_mv *)0x0);
          uVar24 = local_8480;
          if (allow_second_mv != 0 && (bVar32 && bVar33)) {
            if ((ms_params.mv_limits.col_min <= (short)(second_best_mv.as_mv.col * 8)) &&
               ((short)(second_best_mv.as_mv.col * 8) <= ms_params.mv_limits.col_max)) {
              iVar17 = (int)(short)(second_best_mv.as_int << 3);
              if ((ms_params.mv_limits.row_min <= iVar17) &&
                 ((iVar17 <= ms_params.mv_limits.row_max &&
                  (iVar17 = (*(cpi_00->mv_search_params).find_fractional_mv_step)
                                      (local_84a8,local_8448,&ms_params,
                                       (MV)(second_best_mv.as_int << 3 & 0xffff |
                                           (uint)(ushort)second_best_mv.as_mv.col << 0x13),
                                       (FULLPEL_MV_STATS *)0x0,&this_best_mv,&dis,&sse,(int_mv *)0x0
                                      ), iVar17 < iVar18)))) {
                best_mv.as_mv = this_best_mv;
                iVar18 = iVar17;
              }
            }
          }
        }
        uVar25 = local_8458;
        if ((int)local_84b0 != 0) {
          (x->e_mbd).plane[0].pre[0].width = ref_yv12[0].width;
          (x->e_mbd).plane[0].pre[0].height = ref_yv12[0].height;
          (x->e_mbd).plane[0].pre[0].stride = ref_yv12[0].stride;
          *(undefined4 *)&(x->e_mbd).plane[0].pre[0].field_0x1c = ref_yv12[0]._28_4_;
          pbVar1->buf = ref_yv12[0].buf;
          (x->e_mbd).plane[0].pre[0].buf0 = ref_yv12[0].buf0;
        }
        bVar32 = last_besterr[uVar24] <= iVar18;
        if (iVar18 < last_besterr[uVar24]) {
          uVar19 = (ulong)(uint)((int)uVar24 << 2);
          *(int_mv *)((long)local_84b8 + uVar19) = best_mv;
          *(int *)((long)last_besterr + uVar19) = iVar18;
        }
      }
      else {
        bVar32 = true;
        if (*(int *)((long)local_84b8 + (ulong)(uVar30 * 4)) !=
            *(int *)((long)&local_8488 + (ulong)(uVar30 * 4))) {
          uVar19 = (ulong)(uVar30 * 4);
          bVar32 = ((uint)(int)*(short *)((long)local_84b8 + uVar19) >> 3 & 0xffff |
                   ((int)*(short *)((long)local_84b8 + uVar19 + 2) & 0xfffffff8U) << 0xd) ==
                   ((uint)(int)*(short *)((long)&local_8488 + uVar19) >> 3 & 0xffff |
                   ((int)*(short *)((long)&local_8488 + uVar19 + 2) & 0xfffffff8U) << 0xd);
          if (!bVar32) goto LAB_003cbdcd;
        }
      }
    } while ((!bVar32) && (uVar25 = uVar25 + 1, uVar25 != local_845c));
  }
  *rate_mv = 0;
  lVar31 = 0;
  piVar27 = local_84b8;
  do {
    full_ms_params._0_4_ = av1_get_ref_mv(x,(int)lVar31);
    iVar17 = av1_mv_bit_cost(&piVar27->as_mv,(MV *)&full_ms_params,mvjcost->nmv_joint_cost,
                             mvjcost->mv_cost_stack,0x6c);
    *rate_mv = *rate_mv + iVar17;
    lVar31 = lVar31 + 1;
    piVar27 = piVar27 + 1;
  } while (lVar31 == 1);
  if (last_besterr[0] < last_besterr[1]) {
    last_besterr[1] = last_besterr[0];
  }
  return last_besterr[1];
}

Assistant:

int av1_joint_motion_search(const AV1_COMP *cpi, MACROBLOCK *x,
                            BLOCK_SIZE bsize, int_mv *cur_mv,
                            const uint8_t *mask, int mask_stride, int *rate_mv,
                            int allow_second_mv, int joint_me_num_refine_iter) {
  const AV1_COMMON *const cm = &cpi->common;
  const int num_planes = av1_num_planes(cm);
  const int pw = block_size_wide[bsize];
  const int ph = block_size_high[bsize];
  const int plane = 0;
  MACROBLOCKD *xd = &x->e_mbd;
  MB_MODE_INFO *mbmi = xd->mi[0];
  // This function should only ever be called for compound modes
  assert(has_second_ref(mbmi));
  const int_mv init_mv[2] = { cur_mv[0], cur_mv[1] };
  const int refs[2] = { mbmi->ref_frame[0], mbmi->ref_frame[1] };
  const MvCosts *mv_costs = x->mv_costs;
  int_mv ref_mv[2];
  int ite, ref;

  // Get the prediction block from the 'other' reference frame.
  const int_interpfilters interp_filters =
      av1_broadcast_interp_filter(EIGHTTAP_REGULAR);

  InterPredParams inter_pred_params;
  const int mi_row = xd->mi_row;
  const int mi_col = xd->mi_col;

  // Do joint motion search in compound mode to get more accurate mv.
  struct buf_2d backup_yv12[2][MAX_MB_PLANE];
  int last_besterr[2] = { INT_MAX, INT_MAX };
  const YV12_BUFFER_CONFIG *const scaled_ref_frame[2] = {
    av1_get_scaled_ref_frame(cpi, refs[0]),
    av1_get_scaled_ref_frame(cpi, refs[1])
  };

  // Prediction buffer from second frame.
  DECLARE_ALIGNED(16, uint8_t, second_pred16[MAX_SB_SQUARE * sizeof(uint16_t)]);
  uint8_t *second_pred = get_buf_by_bd(xd, second_pred16);

  int_mv best_mv, second_best_mv;

  // Allow joint search multiple times iteratively for each reference frame
  // and break out of the search loop if it couldn't find a better mv.
  for (ite = 0; ite < (2 * joint_me_num_refine_iter); ite++) {
    struct buf_2d ref_yv12[2];
    int bestsme = INT_MAX;
    int id = ite % 2;  // Even iterations search in the first reference frame,
                       // odd iterations search in the second. The predictor
                       // found for the 'other' reference frame is factored in.
    if (ite >= 2 && cur_mv[!id].as_int == init_mv[!id].as_int) {
      if (cur_mv[id].as_int == init_mv[id].as_int) {
        break;
      } else {
        int_mv cur_int_mv, init_int_mv;
        cur_int_mv.as_mv.col = cur_mv[id].as_mv.col >> 3;
        cur_int_mv.as_mv.row = cur_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.row = init_mv[id].as_mv.row >> 3;
        init_int_mv.as_mv.col = init_mv[id].as_mv.col >> 3;
        if (cur_int_mv.as_int == init_int_mv.as_int) {
          break;
        }
      }
    }
    for (ref = 0; ref < 2; ++ref) {
      ref_mv[ref] = av1_get_ref_mv(x, ref);
      // Swap out the reference frame for a version that's been scaled to
      // match the resolution of the current frame, allowing the existing
      // motion search code to be used without additional modifications.
      if (scaled_ref_frame[ref]) {
        int i;
        for (i = 0; i < num_planes; i++)
          backup_yv12[ref][i] = xd->plane[i].pre[ref];
        av1_setup_pre_planes(xd, ref, scaled_ref_frame[ref], mi_row, mi_col,
                             NULL, num_planes);
      }
    }

    assert(IMPLIES(scaled_ref_frame[0] != NULL,
                   cm->width == scaled_ref_frame[0]->y_crop_width &&
                       cm->height == scaled_ref_frame[0]->y_crop_height));
    assert(IMPLIES(scaled_ref_frame[1] != NULL,
                   cm->width == scaled_ref_frame[1]->y_crop_width &&
                       cm->height == scaled_ref_frame[1]->y_crop_height));

    // Initialize based on (possibly scaled) prediction buffers.
    ref_yv12[0] = xd->plane[plane].pre[0];
    ref_yv12[1] = xd->plane[plane].pre[1];

    av1_init_inter_params(&inter_pred_params, pw, ph, mi_row * MI_SIZE,
                          mi_col * MI_SIZE, 0, 0, xd->bd, is_cur_buf_hbd(xd), 0,
                          &cm->sf_identity, &ref_yv12[!id], interp_filters);
    inter_pred_params.conv_params = get_conv_params(0, 0, xd->bd);

    // Since we have scaled the reference frames to match the size of the
    // current frame we must use a unit scaling factor during mode selection.
    av1_enc_build_one_inter_predictor(second_pred, pw, &cur_mv[!id].as_mv,
                                      &inter_pred_params);

    // Do full-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    // Make motion search params
    FULLPEL_MOTION_SEARCH_PARAMS full_ms_params;
    FULLPEL_MV_STATS best_mv_stats;
    const MV_SPEED_FEATURES *mv_sf = &cpi->sf.mv_sf;
    const SEARCH_METHODS search_method =
        av1_get_default_mv_search_method(x, mv_sf, bsize);
    const search_site_config *src_search_sites =
        av1_get_search_site_config(cpi, x, search_method);
    // Use the mv result from the single mode as mv predictor.
    const FULLPEL_MV start_fullmv = get_fullmv_from_mv(&cur_mv[id].as_mv);
    av1_make_default_fullpel_ms_params(&full_ms_params, cpi, x, bsize,
                                       &ref_mv[id].as_mv, start_fullmv,
                                       src_search_sites, search_method,
                                       /*fine_search_interval=*/0);

    av1_set_ms_compound_refs(&full_ms_params.ms_buffers, second_pred, mask,
                             mask_stride, id);

    // Small-range full-pixel motion search.
    if (!mv_sf->disable_extensive_joint_motion_search &&
        mbmi->interinter_comp.type != COMPOUND_WEDGE) {
      bestsme = av1_full_pixel_search(start_fullmv, &full_ms_params, 5, NULL,
                                      &best_mv.as_fullmv, &best_mv_stats,
                                      &second_best_mv.as_fullmv);
    } else {
      bestsme = av1_refining_search_8p_c(&full_ms_params, start_fullmv,
                                         &best_mv.as_fullmv);
      second_best_mv = best_mv;
    }

    const int try_second = second_best_mv.as_int != INVALID_MV &&
                           second_best_mv.as_int != best_mv.as_int &&
                           allow_second_mv;

    // Restore the pointer to the first (possibly scaled) prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];

    for (ref = 0; ref < 2; ++ref) {
      if (scaled_ref_frame[ref]) {
        // Swap back the original buffers for subpel motion search.
        for (int i = 0; i < num_planes; i++) {
          xd->plane[i].pre[ref] = backup_yv12[ref][i];
        }
        // Re-initialize based on unscaled prediction buffers.
        ref_yv12[ref] = xd->plane[plane].pre[ref];
      }
    }

    // Do sub-pixel compound motion search on the current reference frame.
    if (id) xd->plane[plane].pre[0] = ref_yv12[id];

    if (cpi->common.features.cur_frame_force_integer_mv) {
      convert_fullmv_to_mv(&best_mv);
    }
    if (bestsme < INT_MAX &&
        cpi->common.features.cur_frame_force_integer_mv == 0) {
      int dis; /* TODO: use dis in distortion calculation later. */
      unsigned int sse;
      SUBPEL_MOTION_SEARCH_PARAMS ms_params;
      av1_make_default_subpel_ms_params(&ms_params, cpi, x, bsize,
                                        &ref_mv[id].as_mv, NULL);
      av1_set_ms_compound_refs(&ms_params.var_params.ms_buffers, second_pred,
                               mask, mask_stride, id);
      ms_params.forced_stop = EIGHTH_PEL;
      MV start_mv = get_mv_from_fullmv(&best_mv.as_fullmv);
      assert(av1_is_subpelmv_in_range(&ms_params.mv_limits, start_mv));
      bestsme = cpi->mv_search_params.find_fractional_mv_step(
          xd, cm, &ms_params, start_mv, NULL, &best_mv.as_mv, &dis, &sse, NULL);

      if (try_second) {
        MV this_best_mv;
        MV subpel_start_mv = get_mv_from_fullmv(&second_best_mv.as_fullmv);
        if (av1_is_subpelmv_in_range(&ms_params.mv_limits, subpel_start_mv)) {
          const int thissme = cpi->mv_search_params.find_fractional_mv_step(
              xd, cm, &ms_params, subpel_start_mv, NULL, &this_best_mv, &dis,
              &sse, NULL);
          if (thissme < bestsme) {
            best_mv.as_mv = this_best_mv;
            bestsme = thissme;
          }
        }
      }
    }

    // Restore the pointer to the first prediction buffer.
    if (id) xd->plane[plane].pre[0] = ref_yv12[0];
    if (bestsme < last_besterr[id]) {
      cur_mv[id] = best_mv;
      last_besterr[id] = bestsme;
    } else {
      break;
    }
  }

  *rate_mv = 0;

  for (ref = 0; ref < 2; ++ref) {
    const int_mv curr_ref_mv = av1_get_ref_mv(x, ref);
    *rate_mv += av1_mv_bit_cost(&cur_mv[ref].as_mv, &curr_ref_mv.as_mv,
                                mv_costs->nmv_joint_cost,
                                mv_costs->mv_cost_stack, MV_COST_WEIGHT);
  }

  return AOMMIN(last_besterr[0], last_besterr[1]);
}